

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

png_bytep png_read_buffer(png_structrp png_ptr,png_alloc_size_t new_size,int warn)

{
  png_bytep local_28;
  png_bytep buffer;
  int warn_local;
  png_alloc_size_t new_size_local;
  png_structrp png_ptr_local;
  
  local_28 = png_ptr->read_buffer;
  if ((local_28 != (png_bytep)0x0) && (png_ptr->read_buffer_size < new_size)) {
    png_ptr->read_buffer = (png_bytep)0x0;
    png_ptr->read_buffer = (png_bytep)0x0;
    png_ptr->read_buffer_size = 0;
    png_free(png_ptr,local_28);
    local_28 = (png_bytep)0x0;
  }
  if (local_28 == (png_bytep)0x0) {
    local_28 = (png_bytep)png_malloc_base(png_ptr,new_size);
    if (local_28 == (png_bytep)0x0) {
      if (warn < 2) {
        if (warn == 0) {
          png_chunk_error(png_ptr,"insufficient memory to read chunk");
        }
        png_chunk_warning(png_ptr,"insufficient memory to read chunk");
      }
    }
    else {
      memset(local_28,0,new_size);
      png_ptr->read_buffer = local_28;
      png_ptr->read_buffer_size = new_size;
    }
  }
  return local_28;
}

Assistant:

static png_bytep
png_read_buffer(png_structrp png_ptr, png_alloc_size_t new_size, int warn)
{
   png_bytep buffer = png_ptr->read_buffer;

   if (buffer != NULL && new_size > png_ptr->read_buffer_size)
   {
      png_ptr->read_buffer = NULL;
      png_ptr->read_buffer = NULL;
      png_ptr->read_buffer_size = 0;
      png_free(png_ptr, buffer);
      buffer = NULL;
   }

   if (buffer == NULL)
   {
      buffer = png_voidcast(png_bytep, png_malloc_base(png_ptr, new_size));

      if (buffer != NULL)
      {
         memset(buffer, 0, new_size); /* just in case */
         png_ptr->read_buffer = buffer;
         png_ptr->read_buffer_size = new_size;
      }

      else if (warn < 2) /* else silent */
      {
         if (warn != 0)
             png_chunk_warning(png_ptr, "insufficient memory to read chunk");

         else
             png_chunk_error(png_ptr, "insufficient memory to read chunk");
      }
   }

   return buffer;
}